

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O3

bool axl::sys::deleteSimpleTlsSlot(size_t key)

{
  uint_t code;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_28;
  
  code = pthread_key_delete((pthread_key_t)key);
  if (code != 0) {
    err::Error::Error((Error *)&local_28,code);
    local_48.m_p = (ErrorHdr *)0x0;
    local_48.m_hdr = (BufHdr *)0x0;
    local_48.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_28);
    err::setError((ErrorRef *)&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
  }
  return code == 0;
}

Assistant:

bool
deleteSimpleTlsSlot(size_t key) {
	int result = ::pthread_key_delete((pthread_key_t)key);
	return result != 0 ? err::fail(result) : true;
}